

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::AsyncCase::fetchLogMessages(AsyncCase *this)

{
  Mutex *pMVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  undefined4 extraout_var;
  mapped_type *pmVar5;
  TestError *this_00;
  int msgLen;
  GLint numMsg;
  MessageData msg;
  MessageID local_48;
  ScopedLock lock;
  long lVar4;
  
  iVar3 = (*((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar3);
  numMsg = 0;
  (**(code **)(lVar4 + 0x868))(0x9145,&numMsg);
  if (0 < numMsg) {
    paVar2 = &msg.message.field_2;
    pMVar1 = &this->m_mutex;
    iVar3 = 0;
    do {
      msgLen = 0;
      msg.id.source = 0;
      msg.id.type = 0;
      msg.id.id = 0;
      msg.severity = 0;
      msg.message._M_string_length = 0;
      msg.message.field_2._M_local_buf[0] = '\0';
      msg.message._M_dataplus._M_p = (pointer)paVar2;
      (**(code **)(lVar4 + 0x868))(0x8243,&msgLen);
      if (msgLen < 0) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Negative message length","msgLen >= 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
                   ,0x650);
LAB_013af1e5:
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      if (99999 < (uint)msgLen) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Excessively long message","msgLen < 100000",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
                   ,0x651);
        goto LAB_013af1e5;
      }
      std::__cxx11::string::resize((ulong)&msg.message,(char)msgLen);
      (**(code **)(lVar4 + 0x7e0))
                (1,msgLen,&msg,&msg.id.type,&msg.id.id,&msg.severity,&msgLen,
                 msg.message._M_dataplus._M_p);
      lock.m_mutex = pMVar1;
      deMutex_lock(pMVar1->m_mutex);
      local_48.id = msg.id.id;
      local_48.source = msg.id.source;
      local_48.type = msg.id.type;
      pmVar5 = std::
               map<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::AsyncCase::MessageCount,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::AsyncCase::MessageCount>_>_>
               ::operator[](&this->m_counts,&local_48);
      pmVar5->received = pmVar5->received + 1;
      deMutex_unlock(pMVar1->m_mutex);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg.message._M_dataplus._M_p != paVar2) {
        operator_delete(msg.message._M_dataplus._M_p,
                        CONCAT71(msg.message.field_2._M_allocated_capacity._1_7_,
                                 msg.message.field_2._M_local_buf[0]) + 1);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < numMsg);
  }
  return;
}

Assistant:

void AsyncCase::fetchLogMessages (void)
{
	const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
	GLint					numMsg	= 0;

	gl.getIntegerv(GL_DEBUG_LOGGED_MESSAGES, &numMsg);

	for(int msgNdx = 0; msgNdx < numMsg; msgNdx++)
	{
		int			msgLen = 0;
		MessageData msg;

		gl.getIntegerv(GL_DEBUG_NEXT_LOGGED_MESSAGE_LENGTH, &msgLen);

		TCU_CHECK_MSG(msgLen >= 0, "Negative message length");
		TCU_CHECK_MSG(msgLen < 100000, "Excessively long message");

		msg.message.resize(msgLen);
		gl.getDebugMessageLog(1, msgLen, &msg.id.source, &msg.id.type, &msg.id.id, &msg.severity, &msgLen, &msg.message[0]);

		{
			const de::ScopedLock lock(m_mutex); // Don't block during API call

			m_counts[MessageID(msg.id)].received++;
		}
	}
}